

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_address.cpp
# Opt level: O1

int __thiscall zmq::udp_address_t::resolve(udp_address_t *this,char *name_,bool bind_,bool ipv6_)

{
  ip_addr_t *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  udp_address_t *puVar4;
  bool bVar5;
  uint16_t port_;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  ip_resolver_options_t *piVar11;
  int *piVar12;
  undefined7 in_register_00000009;
  undefined8 uVar13;
  ip_resolver_options_t resolver_opts;
  string src_name;
  ip_resolver_t resolver;
  undefined8 local_80;
  udp_address_t *local_78;
  undefined4 local_6c;
  ip_addr_t local_68;
  undefined8 local_48;
  ip_resolver_t local_40;
  
  pcVar10 = (char *)(this->_address)._M_string_length;
  local_78 = this;
  strlen(name_);
  uVar13 = 0;
  std::__cxx11::string::_M_replace((ulong)&this->_address,0,pcVar10,(ulong)name_);
  pcVar10 = strrchr(name_,0x3b);
  if (pcVar10 != (char *)0x0) {
    local_68._0_8_ = (long)&local_68.ipv6.sin6_addr.__in6_u + 8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,name_,pcVar10);
    ip_resolver_options_t::ip_resolver_options_t((ip_resolver_options_t *)&local_80);
    piVar11 = ip_resolver_options_t::bindable((ip_resolver_options_t *)&local_80,true);
    piVar11 = ip_resolver_options_t::allow_dns(piVar11,false);
    piVar11 = ip_resolver_options_t::allow_nic_name(piVar11,true);
    piVar11 = ip_resolver_options_t::ipv6(piVar11,ipv6_);
    ip_resolver_options_t::expect_port(piVar11,false);
    ip_resolver_t::ip_resolver_t
              (&local_40,
               (ip_resolver_options_t)((uint6)local_80._4_4_ << 0x20 | (uint6)(uint)local_80));
    piVar1 = &local_78->_bind_address;
    iVar6 = ip_resolver_t::resolve(&local_40,piVar1,(char *)local_68._0_8_);
    if (iVar6 == 0) {
      bVar5 = ip_addr_t::is_multicast(piVar1);
      if (bVar5) {
        piVar12 = __errno_location();
        *piVar12 = 0x16;
        goto LAB_00190ce4;
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar6 == 0) {
        local_78->_bind_interface = 0;
      }
      else {
        uVar7 = if_nametoindex((char *)local_68._0_8_);
        local_78->_bind_interface = -(uint)(uVar7 == 0) | uVar7;
      }
      name_ = pcVar10 + 1;
      uVar13 = CONCAT71((int7)((ulong)piVar1 >> 8),1);
    }
    else {
LAB_00190ce4:
      uVar13 = 0;
    }
    if ((char *)local_68._0_8_ != (char *)((long)&local_68.ipv6.sin6_addr.__in6_u + 8)) {
      operator_delete((void *)local_68._0_8_,CONCAT44(local_68._20_4_,local_68._16_4_) + 1);
    }
    if ((char)uVar13 == '\0') {
      return -1;
    }
  }
  local_6c = (undefined4)CONCAT71(in_register_00000009,ipv6_);
  local_48 = uVar13;
  ip_resolver_options_t::ip_resolver_options_t((ip_resolver_options_t *)&local_80);
  piVar11 = ip_resolver_options_t::bindable((ip_resolver_options_t *)&local_80,bind_);
  piVar11 = ip_resolver_options_t::allow_dns(piVar11,!bind_);
  piVar11 = ip_resolver_options_t::allow_nic_name(piVar11,bind_);
  piVar11 = ip_resolver_options_t::expect_port(piVar11,true);
  ip_resolver_options_t::ipv6(piVar11,ipv6_);
  ip_resolver_t::ip_resolver_t
            (&local_40,
             (ip_resolver_options_t)((uint6)local_80._4_4_ << 0x20 | (uint6)(uint)local_80));
  puVar4 = local_78;
  piVar1 = &local_78->_target_address;
  iVar6 = ip_resolver_t::resolve(&local_40,piVar1,name_);
  if (iVar6 != 0) {
    return -1;
  }
  bVar5 = ip_addr_t::is_multicast(piVar1);
  puVar4->_is_multicast = bVar5;
  port_ = ip_addr_t::port(piVar1);
  if ((char)local_48 == '\0') {
    if ((!bind_ | puVar4->_is_multicast) == 1) {
      iVar6 = ip_addr_t::family(piVar1);
      ip_addr_t::any(&local_68,iVar6);
      *(ulong *)((long)&puVar4->_bind_address + 0xc) = CONCAT44(local_68._16_4_,local_68._12_4_);
      *(ulong *)((long)&puVar4->_bind_address + 0x14) =
           CONCAT44(local_68.ipv6.sin6_scope_id,local_68._20_4_);
      *(undefined8 *)&puVar4->_bind_address = local_68._0_8_;
      *(ulong *)((long)&puVar4->_bind_address + 8) = CONCAT44(local_68._12_4_,local_68._8_4_);
      ip_addr_t::set_port((ip_addr_t *)&(puVar4->_bind_address).generic,port_);
      puVar4->_bind_interface = 0;
    }
    else {
      uVar13 = *(undefined8 *)piVar1;
      uVar2 = *(undefined8 *)((long)&puVar4->_target_address + 8);
      uVar3 = *(undefined8 *)((long)&puVar4->_target_address + 0x14);
      *(undefined8 *)((long)&puVar4->_bind_address + 0xc) =
           *(undefined8 *)((long)&puVar4->_target_address + 0xc);
      *(undefined8 *)((long)&puVar4->_bind_address + 0x14) = uVar3;
      *(undefined8 *)&puVar4->_bind_address = uVar13;
      *(undefined8 *)((long)&puVar4->_bind_address + 8) = uVar2;
    }
  }
  else {
    iVar6 = 0x16;
    if (puVar4->_is_multicast == false) goto LAB_00190eb0;
    ip_addr_t::set_port((ip_addr_t *)&(puVar4->_bind_address).generic,port_);
  }
  iVar8 = ip_addr_t::family(&puVar4->_bind_address);
  iVar9 = ip_addr_t::family(piVar1);
  iVar6 = 0x16;
  if (iVar8 == iVar9) {
    if ((char)local_6c == '\0') {
      return 0;
    }
    if (puVar4->_is_multicast != true) {
      return 0;
    }
    iVar6 = 0x13;
    if (-1 < puVar4->_bind_interface) {
      return 0;
    }
  }
LAB_00190eb0:
  piVar12 = __errno_location();
  *piVar12 = iVar6;
  return -1;
}

Assistant:

int zmq::udp_address_t::resolve (const char *name_, bool bind_, bool ipv6_)
{
    //  No IPv6 support yet
    bool has_interface = false;

    _address = name_;

    //  If we have a semicolon then we should have an interface specifier in the
    //  URL
    const char *src_delimiter = strrchr (name_, ';');
    if (src_delimiter) {
        const std::string src_name (name_, src_delimiter - name_);

        ip_resolver_options_t src_resolver_opts;

        src_resolver_opts
          .bindable (true)
          //  Restrict hostname/service to literals to avoid any DNS
          //  lookups or service-name irregularity due to
          //  indeterminate socktype.
          .allow_dns (false)
          .allow_nic_name (true)
          .ipv6 (ipv6_)
          .expect_port (false);

        ip_resolver_t src_resolver (src_resolver_opts);

        const int rc = src_resolver.resolve (&_bind_address, src_name.c_str ());

        if (rc != 0) {
            return -1;
        }

        if (_bind_address.is_multicast ()) {
            //  It doesn't make sense to have a multicast address as a source
            errno = EINVAL;
            return -1;
        }

        //  This is a hack because we need the interface index when binding
        //  multicast IPv6, we can't do it by address. Unfortunately for the
        //  time being we don't have a generic platform-independent function to
        //  resolve an interface index from an address, so we only support it
        //  when an actual interface name is provided.
        if (src_name == "*") {
            _bind_interface = 0;
        } else {
#ifdef HAVE_IF_NAMETOINDEX
            _bind_interface = if_nametoindex (src_name.c_str ());
            if (_bind_interface == 0) {
                //  Error, probably not an interface name.
                _bind_interface = -1;
            }
#endif
        }

        has_interface = true;
        name_ = src_delimiter + 1;
    }

    ip_resolver_options_t resolver_opts;

    resolver_opts.bindable (bind_)
      .allow_dns (!bind_)
      .allow_nic_name (bind_)
      .expect_port (true)
      .ipv6 (ipv6_);

    ip_resolver_t resolver (resolver_opts);

    const int rc = resolver.resolve (&_target_address, name_);
    if (rc != 0) {
        return -1;
    }

    _is_multicast = _target_address.is_multicast ();
    const uint16_t port = _target_address.port ();

    if (has_interface) {
        //  If we have an interface specifier then the target address must be a
        //  multicast address
        if (!_is_multicast) {
            errno = EINVAL;
            return -1;
        }

        _bind_address.set_port (port);
    } else {
        //  If we don't have an explicit interface specifier then the URL is
        //  ambiguous: if the target address is multicast then it's the
        //  destination address and the bind address is ANY, if it's unicast
        //  then it's the bind address when 'bind_' is true and the destination
        //  otherwise
        if (_is_multicast || !bind_) {
            _bind_address = ip_addr_t::any (_target_address.family ());
            _bind_address.set_port (port);
            _bind_interface = 0;
        } else {
            //  If we were asked for a bind socket and the address
            //  provided was not multicast then it was really meant as
            //  a bind address and the target_address is useless.
            _bind_address = _target_address;
        }
    }

    if (_bind_address.family () != _target_address.family ()) {
        errno = EINVAL;
        return -1;
    }

    //  For IPv6 multicast we *must* have an interface index since we can't
    //  bind by address.
    if (ipv6_ && _is_multicast && _bind_interface < 0) {
        errno = ENODEV;
        return -1;
    }

    return 0;
}